

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# machine_6502.cc
# Opt level: O0

void __thiscall testbench::machine_6502::trace_CPU(machine_6502 *this)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  int __fd;
  uint uVar12;
  MOS6502 *pMVar13;
  ulong uVar14;
  size_t __nbytes;
  void *__buf;
  machine_6502 *this_local;
  
  bVar1 = machine_implementation::is_trace_enabled(&this->super_machine_implementation);
  if (bVar1) {
    pMVar13 = CPU(this);
    bVar2 = (**(code **)(*(long *)(pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0)) + 0x70))
                      (pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0));
    pMVar13 = CPU(this);
    bVar3 = (**(code **)(*(long *)(pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0)) + 0x78))
                      (pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0));
    pMVar13 = CPU(this);
    bVar4 = (**(code **)(*(long *)(pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0)) + 0x80))
                      (pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0));
    pMVar13 = CPU(this);
    bVar5 = (**(code **)(*(long *)(pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0)) + 0x88))
                      (pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0));
    pMVar13 = CPU(this);
    uVar10 = (**(code **)(*(long *)(pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0)) + 0xa8))
                       (pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0));
    pMVar13 = CPU(this);
    bVar6 = (**(code **)(*(long *)(pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0)) + 0x90))
                      (pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0));
    pMVar13 = CPU(this);
    bVar7 = (**(code **)(*(long *)(pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0)) + 0xb0))
                      (pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0));
    pMVar13 = CPU(this);
    bVar8 = (**(code **)(*(long *)(pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0)) + 0x48))
                      (pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0),0x22);
    pMVar13 = CPU(this);
    uVar11 = (**(code **)(*(long *)(pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0)) + 0x58))
                       (pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0));
    pMVar13 = CPU(this);
    bVar9 = (**(code **)(*(long *)(pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0)) + 0x60))
                      (pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0));
    machine_implementation::print_trace
              (&this->super_machine_implementation,
               "A:%02X X:%02X Y:%02X P:%02X PC:%04X S:%02X IR:%02X RW:%d AB:%04X DB:%02X\n",
               (ulong)bVar2,(ulong)bVar3,(ulong)bVar4,(ulong)bVar5,uVar10,(uint)bVar6,
               (bVar7 ^ 0xffffffff) & 0xff,(uint)(bVar8 & 1),uVar11,(uint)bVar9);
    pMVar13 = CPU(this);
    uVar14 = (**(code **)(*(long *)(pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0)) + 0x48))
                       (pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0),0x22);
    if ((uVar14 & 1) == 0) {
      pMVar13 = CPU(this);
      uVar12 = (**(code **)(*(long *)(pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0)) + 0x58))
                         (pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0));
      pMVar13 = CPU(this);
      bVar2 = (**(code **)(*(long *)(pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0)) + 0x60))
                        (pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0));
      machine_implementation::print_trace
                (&this->super_machine_implementation," write $%04X - $%02X\n",(ulong)uVar12,
                 (ulong)bVar2);
    }
    else {
      pMVar13 = CPU(this);
      uVar12 = (**(code **)(*(long *)(pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0)) + 0x58))
                         (pMVar13 + *(long *)(*(long *)pMVar13 + -0xd0));
      pMVar13 = CPU(this);
      __nbytes = *(size_t *)(*(long *)pMVar13 + -0xd0);
      __fd = (**(code **)(*(long *)(pMVar13 + __nbytes) + 0x58))(pMVar13 + __nbytes);
      uVar14 = memory::read(&this->memory,__fd,__buf,__nbytes);
      machine_implementation::print_trace
                (&this->super_machine_implementation," read $%04X - $%02X\n",(ulong)uVar12,
                 uVar14 & 0xff);
    }
  }
  return;
}

Assistant:

inline void machine_6502::trace_CPU()
{
    if (not is_trace_enabled()) return;

    print_trace("A:%02X X:%02X Y:%02X P:%02X PC:%04X S:%02X"
                " IR:%02X RW:%d AB:%04X DB:%02X\n",
                CPU()->A(), CPU()->X(), CPU()->Y(), CPU()->P(),
                CPU()->PC(), CPU()->S(),
                (~(CPU()->IR())) & 0xff,
                CPU()->pin_read(MOS6502::RW),
                CPU()->read_address_bus(),
                CPU()->read_data_bus());
    if (CPU()->pin_read(MOS6502::RW)) {
        print_trace(" read $%04X - $%02X\n",
                    CPU()->read_address_bus(),
                    memory.read(CPU()->read_address_bus()));
    }
    else {
        print_trace(" write $%04X - $%02X\n",
                    CPU()->read_address_bus(),
                    CPU()->read_data_bus());
    }
}